

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Tag *pTVar7;
  Tag *pTVar8;
  bool bVar9;
  
  iVar1 = this->tags_size_;
  bVar9 = true;
  if (iVar1 <= this->tags_count_) {
    iVar2 = 1;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    lVar6 = (long)iVar2 * 0x10;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = lVar6 + 8;
    }
    plVar3 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (plVar3 == (long *)0x0) {
      pTVar7 = (Tag *)0x0;
    }
    else {
      *plVar3 = (long)iVar2;
      pTVar7 = (Tag *)(plVar3 + 1);
      lVar4 = 0;
      pTVar8 = pTVar7;
      do {
        Tag::Tag(pTVar8);
        lVar4 = lVar4 + -0x10;
        pTVar8 = pTVar8 + 1;
      } while (-lVar4 != lVar6);
    }
    bVar9 = pTVar7 != (Tag *)0x0;
    if (bVar9) {
      iVar1 = this->tags_count_;
      if (0 < (long)iVar1) {
        pTVar8 = this->tags_;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)&pTVar7->simple_tags_ + lVar6) =
               *(undefined8 *)((long)&pTVar8->simple_tags_ + lVar6);
          *(undefined8 *)((long)&pTVar7->simple_tags_size_ + lVar6) =
               *(undefined8 *)((long)&pTVar8->simple_tags_size_ + lVar6);
          lVar6 = lVar6 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar6);
      }
      pTVar8 = this->tags_;
      if (pTVar8 != (Tag *)0x0) {
        lVar6._0_4_ = pTVar8[-1].simple_tags_size_;
        lVar6._4_4_ = pTVar8[-1].simple_tags_count_;
        if (lVar6 != 0) {
          lVar6 = lVar6 << 4;
          do {
            Tag::~Tag((Tag *)((long)&pTVar8[-1].simple_tags_ + lVar6));
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar8[-1].simple_tags_size_);
      }
      this->tags_ = pTVar7;
      this->tags_size_ = iVar2;
    }
  }
  return bVar9;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}